

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadSocketData(ReadData *this,BUFF *buff,int desc)

{
  undefined4 uVar1;
  ssize_t sVar2;
  int local_440;
  int i;
  uchar local_428 [4];
  int num;
  uchar tmp [1024];
  int count;
  int desc_local;
  BUFF *buff_local;
  ReadData *this_local;
  
  tmp._1020_4_ = desc;
  if (buff->pos != 0) {
    reset(this,buff);
  }
  tmp._1016_4_ = buff->pos;
  while ((int)tmp._1016_4_ < 0x7698) {
    memset(local_428,0,0x400);
    sVar2 = recv(tmp._1020_4_,local_428,0x400,0);
    for (local_440 = 0; uVar1 = tmp._1016_4_, local_440 < (int)sVar2; local_440 = local_440 + 1) {
      tmp._1016_4_ = tmp._1016_4_ + 1;
      buff->buff[(int)uVar1] = local_428[local_440];
    }
  }
  buff->len = tmp._1016_4_;
  buff->pos = 0;
  return 0;
}

Assistant:

int ReadData::ReadSocketData(BUFF &buff, int desc) {
    // 将数据先读入缓冲区
    if(buff.pos != 0)
        reset(buff);
    int count = buff.pos;
    try
    {
        while (count < MAXDATALEN)
        {
            unsigned char tmp[1024];
            memset(tmp, 0x00, 1024);
            int num = recv(desc, tmp, 1024, 0);
            for(int i = 0; i < num; ++i)
                buff.buff[count++] = tmp[i];
            // buff[count] = tmp;
        }
        buff.len = count;
        buff.pos = 0;
        return 0;
    }
    catch(...)
    {
        cout << "error happened when getting data from socket" << endl;
        return UNKNOWN_ERROR;
    } 
}